

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# gd.cc
# Opt level: O3

base_learner * GD::setup(options_i *options,vw *all)

{
  _func_int **pp_Var1;
  size_t *psVar2;
  _func_float_gd_ptr_base_learner_ptr_example_ptr *p_Var3;
  undefined8 uVar4;
  long lVar5;
  double dVar6;
  int iVar7;
  int iVar8;
  gd *g;
  option_group_definition *poVar9;
  typed_option<float> *op;
  typed_option<double> *ptVar10;
  typed_option<unsigned_long> *ptVar11;
  size_t sVar12;
  ostream *poVar13;
  code *pcVar14;
  uint64_t uVar15;
  ulong uVar16;
  learner<GD::gd,_example> *plVar17;
  vw_exception *this;
  uint32_t stride_shift;
  code *pcVar18;
  uint32_t *puVar19;
  code *pcVar20;
  bool bVar21;
  byte bVar22;
  options_i *this_00;
  bool bVar23;
  float fVar24;
  bool normalized;
  bool invariant;
  bool adax;
  bool adaptive;
  bool sgd;
  option_group_definition new_options;
  stringstream __msg;
  bool local_8ad;
  bool local_8ac;
  bool local_8ab;
  bool local_8aa;
  bool local_8a9;
  options_i *local_8a8;
  free_ptr<GD::gd> local_8a0;
  string local_890;
  string local_870;
  undefined1 *local_850 [2];
  undefined1 local_840 [16];
  string local_830;
  undefined1 *local_810 [2];
  undefined1 local_800 [16];
  string local_7f0;
  undefined1 *local_7d0 [2];
  undefined1 local_7c0 [16];
  string local_7b0;
  undefined1 *local_790 [2];
  undefined1 local_780 [16];
  string local_770;
  undefined1 *local_750 [2];
  undefined1 local_740 [16];
  string local_730;
  undefined1 *local_710 [2];
  undefined1 local_700 [16];
  string local_6f0;
  undefined1 *local_6d0;
  long local_6c8;
  undefined1 local_6c0 [16];
  option_group_definition local_6b0;
  undefined1 *local_678 [2];
  undefined1 local_668 [16];
  undefined1 *local_658 [2];
  undefined1 local_648 [16];
  string local_638;
  undefined1 local_618 [136];
  __shared_count<(__gnu_cxx::_Lock_policy)2> local_590;
  __shared_count<(__gnu_cxx::_Lock_policy)2> local_580;
  undefined1 local_578 [48];
  string local_548 [88];
  __shared_count<(__gnu_cxx::_Lock_policy)2> local_4f0;
  __shared_count<(__gnu_cxx::_Lock_policy)2> local_4e0;
  undefined1 local_3f0 [136];
  __shared_count<(__gnu_cxx::_Lock_policy)2> local_368;
  __shared_count<(__gnu_cxx::_Lock_policy)2> local_358;
  undefined1 local_350 [136];
  __shared_count<(__gnu_cxx::_Lock_policy)2> local_2c8;
  __shared_count<(__gnu_cxx::_Lock_policy)2> local_2b8;
  undefined1 local_2b0 [136];
  __shared_count<(__gnu_cxx::_Lock_policy)2> local_228;
  __shared_count<(__gnu_cxx::_Lock_policy)2> local_218;
  typed_option<double> local_210;
  typed_option<double> local_170;
  typed_option<float> local_d0;
  
  local_8a8 = options;
  g = calloc_or_throw<GD::gd>(1);
  g->total_weight = 0.0;
  g->no_win_counter = 0;
  g->early_stop_thres = 0;
  g->initial_constant = 0.0;
  g->neg_norm_power = 0.0;
  g->neg_power_t = 0.0;
  g->sparse_l2 = 0.0;
  *(undefined8 *)&g->update_multiplier = 0;
  g->predict = (_func_void_gd_ptr_base_learner_ptr_example_ptr *)0x0;
  g->learn = (_func_void_gd_ptr_base_learner_ptr_example_ptr *)0x0;
  g->update = (_func_void_gd_ptr_base_learner_ptr_example_ptr *)0x0;
  g->sensitivity = (_func_float_gd_ptr_base_learner_ptr_example_ptr *)0x0;
  g->multipredict =
       (_func_void_gd_ptr_base_learner_ptr_example_ptr_size_t_size_t_polyprediction_ptr_bool *)0x0;
  g->normalized = false;
  g->adaptive = false;
  g->adax = false;
  *(undefined5 *)&g->field_0x5b = 0;
  g->all = (vw *)0x0;
  local_8a0._M_t.super___uniq_ptr_impl<GD::gd,_void_(*)(void_*)>._M_t.
  super__Tuple_impl<0UL,_GD::gd_*,_void_(*)(void_*)>.super__Tuple_impl<1UL,_void_(*)(void_*)>.
  super__Head_base<1UL,_void_(*)(void_*),_false>._M_head_impl =
       (_Head_base<1UL,_void_(*)(void_*),_false>)destroy_free<GD::gd>;
  local_8a9 = false;
  local_8aa = false;
  local_8ab = false;
  local_8ac = false;
  local_8ad = false;
  local_8a0._M_t.super___uniq_ptr_impl<GD::gd,_void_(*)(void_*)>._M_t.
  super__Tuple_impl<0UL,_GD::gd_*,_void_(*)(void_*)>.super__Head_base<0UL,_GD::gd_*,_false>.
  _M_head_impl = g;
  local_6d0 = local_6c0;
  std::__cxx11::string::_M_construct<char_const*>
            ((string *)&local_6d0,"Gradient Descent options","");
  local_6b0.m_name._M_dataplus._M_p = (pointer)&local_6b0.m_name.field_2;
  std::__cxx11::string::_M_construct<char*>((string *)&local_6b0,local_6d0,local_6d0 + local_6c8);
  local_6b0.m_options.
  super__Vector_base<std::shared_ptr<VW::config::base_option>,_std::allocator<std::shared_ptr<VW::config::base_option>_>_>
  ._M_impl.super__Vector_impl_data._M_start = (pointer)0x0;
  local_6b0.m_options.
  super__Vector_base<std::shared_ptr<VW::config::base_option>,_std::allocator<std::shared_ptr<VW::config::base_option>_>_>
  ._M_impl.super__Vector_impl_data._M_finish = (pointer)0x0;
  local_6b0.m_options.
  super__Vector_base<std::shared_ptr<VW::config::base_option>,_std::allocator<std::shared_ptr<VW::config::base_option>_>_>
  ._M_impl.super__Vector_impl_data._M_end_of_storage = (pointer)0x0;
  if (local_6d0 != local_6c0) {
    operator_delete(local_6d0);
  }
  local_6f0._M_dataplus._M_p = (pointer)&local_6f0.field_2;
  std::__cxx11::string::_M_construct<char_const*>((string *)&local_6f0,"sgd","");
  VW::config::typed_option<bool>::typed_option
            ((typed_option<bool> *)local_578,&local_6f0,&local_8a9);
  local_710[0] = local_700;
  std::__cxx11::string::_M_construct<char_const*>
            ((string *)local_710,"use regular stochastic gradient descent update.","");
  std::__cxx11::string::_M_assign(local_548);
  poVar9 = VW::config::option_group_definition::add<VW::config::typed_option<bool>&>
                     (&local_6b0,(typed_option<bool> *)local_578);
  local_730._M_dataplus._M_p = (pointer)&local_730.field_2;
  std::__cxx11::string::_M_construct<char_const*>((string *)&local_730,"adaptive","");
  VW::config::typed_option<bool>::typed_option
            ((typed_option<bool> *)local_618,&local_730,&local_8aa);
  local_750[0] = local_740;
  std::__cxx11::string::_M_construct<char_const*>
            ((string *)local_750,"use adaptive, individual learning rates.","");
  std::__cxx11::string::_M_assign((string *)(local_618 + 0x30));
  poVar9 = VW::config::option_group_definition::add<VW::config::typed_option<bool>&>
                     (poVar9,(typed_option<bool> *)local_618);
  local_770._M_dataplus._M_p = (pointer)&local_770.field_2;
  std::__cxx11::string::_M_construct<char_const*>((string *)&local_770,"adax","");
  VW::config::typed_option<bool>::typed_option
            ((typed_option<bool> *)local_2b0,&local_770,&local_8ab);
  local_790[0] = local_780;
  std::__cxx11::string::_M_construct<char_const*>
            ((string *)local_790,"use adaptive learning rates with x^2 instead of g^2x^2","");
  std::__cxx11::string::_M_assign((string *)(local_2b0 + 0x30));
  poVar9 = VW::config::option_group_definition::add<VW::config::typed_option<bool>&>
                     (poVar9,(typed_option<bool> *)local_2b0);
  local_7b0._M_dataplus._M_p = (pointer)&local_7b0.field_2;
  std::__cxx11::string::_M_construct<char_const*>((string *)&local_7b0,"invariant","");
  VW::config::typed_option<bool>::typed_option
            ((typed_option<bool> *)local_350,&local_7b0,&local_8ac);
  local_7d0[0] = local_7c0;
  std::__cxx11::string::_M_construct<char_const*>
            ((string *)local_7d0,"use safe/importance aware updates.","");
  std::__cxx11::string::_M_assign((string *)(local_350 + 0x30));
  poVar9 = VW::config::option_group_definition::add<VW::config::typed_option<bool>&>
                     (poVar9,(typed_option<bool> *)local_350);
  local_7f0._M_dataplus._M_p = (pointer)&local_7f0.field_2;
  std::__cxx11::string::_M_construct<char_const*>((string *)&local_7f0,"normalized","");
  VW::config::typed_option<bool>::typed_option
            ((typed_option<bool> *)local_3f0,&local_7f0,&local_8ad);
  local_810[0] = local_800;
  std::__cxx11::string::_M_construct<char_const*>
            ((string *)local_810,"use per feature normalized updates","");
  std::__cxx11::string::_M_assign((string *)(local_3f0 + 0x30));
  poVar9 = VW::config::option_group_definition::add<VW::config::typed_option<bool>&>
                     (poVar9,(typed_option<bool> *)local_3f0);
  local_830._M_dataplus._M_p = (pointer)&local_830.field_2;
  std::__cxx11::string::_M_construct<char_const*>((string *)&local_830,"sparse_l2","");
  VW::config::typed_option<float>::typed_option(&local_d0,&local_830,&g->sparse_l2);
  op = VW::config::typed_option<float>::default_value(&local_d0,0.0);
  local_850[0] = local_840;
  std::__cxx11::string::_M_construct<char_const*>
            ((string *)local_850,"use per feature normalized updates","");
  std::__cxx11::string::_M_assign((string *)&(op->super_base_option).m_help);
  poVar9 = VW::config::option_group_definition::add<VW::config::typed_option<float>&>(poVar9,op);
  local_870._M_dataplus._M_p = (pointer)&local_870.field_2;
  std::__cxx11::string::_M_construct<char_const*>((string *)&local_870,"l1_state","");
  VW::config::typed_option<double>::typed_option(&local_170,&local_870,&all->sd->gravity);
  local_170.super_base_option.m_keep = all->save_resume;
  ptVar10 = VW::config::typed_option<double>::default_value(&local_170,0.0);
  local_658[0] = local_648;
  std::__cxx11::string::_M_construct<char_const*>
            ((string *)local_658,"use per feature normalized updates","");
  std::__cxx11::string::_M_assign((string *)&(ptVar10->super_base_option).m_help);
  poVar9 = VW::config::option_group_definition::add<VW::config::typed_option<double>&>
                     (poVar9,ptVar10);
  local_890._M_dataplus._M_p = (pointer)&local_890.field_2;
  std::__cxx11::string::_M_construct<char_const*>((string *)&local_890,"l2_state","");
  VW::config::typed_option<double>::typed_option(&local_210,&local_890,&all->sd->contraction);
  local_210.super_base_option.m_keep = all->save_resume;
  ptVar10 = VW::config::typed_option<double>::default_value(&local_210,1.0);
  local_678[0] = local_668;
  std::__cxx11::string::_M_construct<char_const*>
            ((string *)local_678,"use per feature normalized updates","");
  std::__cxx11::string::_M_assign((string *)&(ptVar10->super_base_option).m_help);
  VW::config::option_group_definition::add<VW::config::typed_option<double>&>(poVar9,ptVar10);
  if (local_678[0] != local_668) {
    operator_delete(local_678[0]);
  }
  local_210.super_base_option._vptr_base_option = (_func_int **)&PTR__typed_option_002da2b0;
  if (local_210.m_default_value.super___shared_ptr<double,_(__gnu_cxx::_Lock_policy)2>._M_refcount.
      _M_pi != (_Sp_counted_base<(__gnu_cxx::_Lock_policy)2> *)0x0) {
    std::_Sp_counted_base<(__gnu_cxx::_Lock_policy)2>::_M_release
              (local_210.m_default_value.super___shared_ptr<double,_(__gnu_cxx::_Lock_policy)2>.
               _M_refcount._M_pi);
  }
  if (local_210.m_value.super___shared_ptr<double,_(__gnu_cxx::_Lock_policy)2>._M_refcount._M_pi !=
      (_Sp_counted_base<(__gnu_cxx::_Lock_policy)2> *)0x0) {
    std::_Sp_counted_base<(__gnu_cxx::_Lock_policy)2>::_M_release
              (local_210.m_value.super___shared_ptr<double,_(__gnu_cxx::_Lock_policy)2>._M_refcount.
               _M_pi);
  }
  VW::config::base_option::~base_option(&local_210.super_base_option);
  if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
       *)local_890._M_dataplus._M_p != &local_890.field_2) {
    operator_delete(local_890._M_dataplus._M_p);
  }
  if (local_658[0] != local_648) {
    operator_delete(local_658[0]);
  }
  local_170.super_base_option._vptr_base_option = (_func_int **)&PTR__typed_option_002da2b0;
  if (local_170.m_default_value.super___shared_ptr<double,_(__gnu_cxx::_Lock_policy)2>._M_refcount.
      _M_pi != (_Sp_counted_base<(__gnu_cxx::_Lock_policy)2> *)0x0) {
    std::_Sp_counted_base<(__gnu_cxx::_Lock_policy)2>::_M_release
              (local_170.m_default_value.super___shared_ptr<double,_(__gnu_cxx::_Lock_policy)2>.
               _M_refcount._M_pi);
  }
  if (local_170.m_value.super___shared_ptr<double,_(__gnu_cxx::_Lock_policy)2>._M_refcount._M_pi !=
      (_Sp_counted_base<(__gnu_cxx::_Lock_policy)2> *)0x0) {
    std::_Sp_counted_base<(__gnu_cxx::_Lock_policy)2>::_M_release
              (local_170.m_value.super___shared_ptr<double,_(__gnu_cxx::_Lock_policy)2>._M_refcount.
               _M_pi);
  }
  VW::config::base_option::~base_option(&local_170.super_base_option);
  if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
       *)local_870._M_dataplus._M_p != &local_870.field_2) {
    operator_delete(local_870._M_dataplus._M_p);
  }
  if (local_850[0] != local_840) {
    operator_delete(local_850[0]);
  }
  local_d0.super_base_option._vptr_base_option = (_func_int **)&PTR__typed_option_002da240;
  if (local_d0.m_default_value.super___shared_ptr<float,_(__gnu_cxx::_Lock_policy)2>._M_refcount.
      _M_pi != (_Sp_counted_base<(__gnu_cxx::_Lock_policy)2> *)0x0) {
    std::_Sp_counted_base<(__gnu_cxx::_Lock_policy)2>::_M_release
              (local_d0.m_default_value.super___shared_ptr<float,_(__gnu_cxx::_Lock_policy)2>.
               _M_refcount._M_pi);
  }
  if (local_d0.m_value.super___shared_ptr<float,_(__gnu_cxx::_Lock_policy)2>._M_refcount._M_pi !=
      (_Sp_counted_base<(__gnu_cxx::_Lock_policy)2> *)0x0) {
    std::_Sp_counted_base<(__gnu_cxx::_Lock_policy)2>::_M_release
              (local_d0.m_value.super___shared_ptr<float,_(__gnu_cxx::_Lock_policy)2>._M_refcount.
               _M_pi);
  }
  VW::config::base_option::~base_option(&local_d0.super_base_option);
  if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
       *)local_830._M_dataplus._M_p != &local_830.field_2) {
    operator_delete(local_830._M_dataplus._M_p);
  }
  if (local_810[0] != local_800) {
    operator_delete(local_810[0]);
  }
  local_3f0._0_8_ = &PTR__typed_option_002da130;
  if (local_358._M_pi != (_Sp_counted_base<(__gnu_cxx::_Lock_policy)2> *)0x0) {
    std::_Sp_counted_base<(__gnu_cxx::_Lock_policy)2>::_M_release(local_358._M_pi);
  }
  if (local_368._M_pi != (_Sp_counted_base<(__gnu_cxx::_Lock_policy)2> *)0x0) {
    std::_Sp_counted_base<(__gnu_cxx::_Lock_policy)2>::_M_release(local_368._M_pi);
  }
  VW::config::base_option::~base_option((base_option *)local_3f0);
  if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
       *)local_7f0._M_dataplus._M_p != &local_7f0.field_2) {
    operator_delete(local_7f0._M_dataplus._M_p);
  }
  if (local_7d0[0] != local_7c0) {
    operator_delete(local_7d0[0]);
  }
  local_350._0_8_ = &PTR__typed_option_002da130;
  if (local_2b8._M_pi != (_Sp_counted_base<(__gnu_cxx::_Lock_policy)2> *)0x0) {
    std::_Sp_counted_base<(__gnu_cxx::_Lock_policy)2>::_M_release(local_2b8._M_pi);
  }
  if (local_2c8._M_pi != (_Sp_counted_base<(__gnu_cxx::_Lock_policy)2> *)0x0) {
    std::_Sp_counted_base<(__gnu_cxx::_Lock_policy)2>::_M_release(local_2c8._M_pi);
  }
  VW::config::base_option::~base_option((base_option *)local_350);
  if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
       *)local_7b0._M_dataplus._M_p != &local_7b0.field_2) {
    operator_delete(local_7b0._M_dataplus._M_p);
  }
  if (local_790[0] != local_780) {
    operator_delete(local_790[0]);
  }
  local_2b0._0_8_ = &PTR__typed_option_002da130;
  if (local_218._M_pi != (_Sp_counted_base<(__gnu_cxx::_Lock_policy)2> *)0x0) {
    std::_Sp_counted_base<(__gnu_cxx::_Lock_policy)2>::_M_release(local_218._M_pi);
  }
  if (local_228._M_pi != (_Sp_counted_base<(__gnu_cxx::_Lock_policy)2> *)0x0) {
    std::_Sp_counted_base<(__gnu_cxx::_Lock_policy)2>::_M_release(local_228._M_pi);
  }
  VW::config::base_option::~base_option((base_option *)local_2b0);
  if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
       *)local_770._M_dataplus._M_p != &local_770.field_2) {
    operator_delete(local_770._M_dataplus._M_p);
  }
  if (local_750[0] != local_740) {
    operator_delete(local_750[0]);
  }
  local_618._0_8_ = &PTR__typed_option_002da130;
  if (local_580._M_pi != (_Sp_counted_base<(__gnu_cxx::_Lock_policy)2> *)0x0) {
    std::_Sp_counted_base<(__gnu_cxx::_Lock_policy)2>::_M_release(local_580._M_pi);
  }
  if (local_590._M_pi != (_Sp_counted_base<(__gnu_cxx::_Lock_policy)2> *)0x0) {
    std::_Sp_counted_base<(__gnu_cxx::_Lock_policy)2>::_M_release(local_590._M_pi);
  }
  VW::config::base_option::~base_option((base_option *)local_618);
  if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
       *)local_730._M_dataplus._M_p != &local_730.field_2) {
    operator_delete(local_730._M_dataplus._M_p);
  }
  if (local_710[0] != local_700) {
    operator_delete(local_710[0]);
  }
  local_578._0_8_ = &PTR__typed_option_002da130;
  if (local_4e0._M_pi != (_Sp_counted_base<(__gnu_cxx::_Lock_policy)2> *)0x0) {
    std::_Sp_counted_base<(__gnu_cxx::_Lock_policy)2>::_M_release(local_4e0._M_pi);
  }
  if (local_4f0._M_pi != (_Sp_counted_base<(__gnu_cxx::_Lock_policy)2> *)0x0) {
    std::_Sp_counted_base<(__gnu_cxx::_Lock_policy)2>::_M_release(local_4f0._M_pi);
  }
  VW::config::base_option::~base_option((base_option *)local_578);
  if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
       *)local_6f0._M_dataplus._M_p != &local_6f0.field_2) {
    operator_delete(local_6f0._M_dataplus._M_p);
  }
  this_00 = local_8a8;
  (**local_8a8->_vptr_options_i)(local_8a8,&local_6b0);
  g->all = all;
  all->normalized_sum_norm_x = 0.0;
  g->total_weight = 0.0;
  g->no_win_counter = 0;
  fVar24 = -1.0;
  if (all->adaptive != false) {
    fVar24 = all->power_t + -1.0;
  }
  g->neg_norm_power = fVar24;
  g->neg_power_t = -all->power_t;
  g->adaptive = all->adaptive;
  g->normalized = all->normalized_updates;
  if (0.0 < all->initial_t) {
    g->all->normalized_sum_norm_x = (double)all->initial_t;
    g->total_weight = (double)all->initial_t;
  }
  pp_Var1 = (_func_int **)(local_578 + 0x10);
  local_578._0_8_ = pp_Var1;
  std::__cxx11::string::_M_construct<char_const*>((string *)local_578,"feature_mask","");
  iVar7 = (*this_00->_vptr_options_i[1])(this_00,local_578);
  if ((_func_int **)local_578._0_8_ != pp_Var1) {
    operator_delete((void *)local_578._0_8_);
  }
  if (all->holdout_set_off == false) {
    all->sd->holdout_best_loss = 3.4028234663852886e+38;
    local_578._0_8_ = pp_Var1;
    std::__cxx11::string::_M_construct<char_const*>((string *)local_578,"early_terminate","");
    ptVar11 = VW::config::options_i::get_typed_option<unsigned_long>(this_00,(string *)local_578);
    psVar2 = (ptVar11->m_value).super___shared_ptr<unsigned_long,_(__gnu_cxx::_Lock_policy)2>._M_ptr
    ;
    if (psVar2 == (size_t *)0x0) {
      sVar12 = 0;
    }
    else {
      sVar12 = *psVar2;
    }
    g->early_stop_thres = sVar12;
    if ((_func_int **)local_578._0_8_ != pp_Var1) {
      operator_delete((void *)local_578._0_8_);
    }
  }
  g->initial_constant = all->initial_constant;
  if ((((local_8a9 == true) || ((local_8aa & 1U) != 0)) || ((local_8ac & 1U) != 0)) ||
     (local_8ad == true)) {
    bVar23 = all->training == false;
    bVar21 = local_8aa;
    if (bVar23) {
      bVar21 = false;
    }
    all->adaptive = bVar21;
    bVar21 = local_8ac;
    if (bVar23) {
      bVar21 = false;
    }
    all->invariant_updates = bVar21;
    bVar21 = local_8ad;
    if (bVar23) {
      bVar21 = false;
    }
    all->normalized_updates = bVar21;
    local_578._0_8_ = pp_Var1;
    std::__cxx11::string::_M_construct<char_const*>((string *)local_578,"learning_rate","");
    iVar8 = (*this_00->_vptr_options_i[1])(this_00,local_578);
    if ((char)iVar8 == '\0') {
      local_618._0_8_ = local_618 + 0x10;
      std::__cxx11::string::_M_construct<char_const*>((string *)local_618,"l","");
      iVar8 = (*local_8a8->_vptr_options_i[1])(local_8a8,local_618);
      bVar21 = all->normalized_updates;
      bVar23 = all->adaptive;
      if ((undefined1 *)local_618._0_8_ != local_618 + 0x10) {
        operator_delete((void *)local_618._0_8_);
      }
      bVar22 = ((byte)iVar8 | bVar21 & bVar23) ^ 1;
      this_00 = local_8a8;
    }
    else {
      bVar22 = 0;
    }
    if ((_func_int **)local_578._0_8_ != pp_Var1) {
      operator_delete((void *)local_578._0_8_);
    }
    if ((bVar22 & 1) != 0) {
      all->eta = 10.0;
    }
    if ((all->adaptive == false) && (all->normalized_updates == false)) {
      local_578._0_8_ = pp_Var1;
      std::__cxx11::string::_M_construct<char_const*>((string *)local_578,"initial_t","");
      iVar8 = (*this_00->_vptr_options_i[1])(this_00,local_578);
      if ((_func_int **)local_578._0_8_ != pp_Var1) {
        operator_delete((void *)local_578._0_8_);
      }
      if ((char)iVar8 == '\0') {
        all->sd->t = 1.0;
        all->initial_t = 1.0;
      }
      fVar24 = powf((float)all->sd->t,all->power_t);
      all->eta = fVar24 * all->eta;
    }
  }
  else {
    bVar21 = all->training;
    all->adaptive = bVar21;
    all->invariant_updates = bVar21;
    all->normalized_updates = bVar21;
  }
  if (local_8ab == false) {
    bVar22 = g->adax;
  }
  else {
    bVar22 = all->training;
    g->adax = (bool)bVar22;
  }
  if (((bVar22 & 1) != 0) && (all->adaptive == false)) {
    std::__cxx11::stringstream::stringstream((stringstream *)local_578);
    std::__ostream_insert<char,std::char_traits<char>>
              ((ostream *)(local_578 + 0x10),"Cannot use adax without adaptive",0x20);
    this = (vw_exception *)__cxa_allocate_exception(0x38);
    std::__cxx11::stringbuf::str();
    VW::vw_exception::vw_exception
              (this,
               "/workspace/llm4binary/github/license_all_cmakelists_1510/LAIRLAB[P]vowpal_wabbit/vowpalwabbit/gd.cc"
               ,0x48e,&local_638);
    __cxa_throw(this,&VW::vw_exception::typeinfo,VW::vw_exception::~vw_exception);
  }
  dVar6 = pow((double)all->eta_decay_rate,
              ((double)CONCAT44(0x45300000,(int)(all->numpasses >> 0x20)) - 1.9342813113834067e+25)
              + ((double)CONCAT44(0x43300000,(int)all->numpasses) - 4503599627370496.0));
  if (dVar6 < 0.0001) {
    std::__ostream_insert<char,std::char_traits<char>>
              (&(all->trace_message).super_ostream,
               "Warning: the learning rate for the last pass is multiplied by: ",0x3f);
    dVar6 = pow((double)all->eta_decay_rate,
                ((double)CONCAT44(0x45300000,(int)(all->numpasses >> 0x20)) - 1.9342813113834067e+25
                ) + ((double)CONCAT44(0x43300000,(int)all->numpasses) - 4503599627370496.0));
    poVar13 = std::ostream::_M_insert<double>(dVar6);
    std::__ostream_insert<char,std::char_traits<char>>
              (poVar13," adjust --decay_learning_rate larger to avoid this.",0x33);
    std::ios::widen((char)poVar13->_vptr_basic_ostream[-3] + (char)poVar13);
    std::ostream::put((char)poVar13);
    std::ostream::flush();
  }
  if ((all->reg_mode & 1) == 0) {
    if (all->audit != false) {
      pcVar14 = predict<false,true>;
      pcVar18 = multipredict<false,true>;
      goto LAB_0013be04;
    }
    pcVar14 = predict<false,false>;
    bVar21 = all->hash_inv == false;
    if (!bVar21) {
      pcVar14 = predict<false,true>;
    }
    pcVar20 = multipredict<false,true>;
    pcVar18 = multipredict<false,false>;
  }
  else {
    if (all->audit != false) {
      pcVar18 = multipredict<true,true>;
      pcVar14 = predict<true,true>;
      goto LAB_0013be04;
    }
    pcVar14 = predict<true,false>;
    bVar21 = all->hash_inv == false;
    if (!bVar21) {
      pcVar14 = predict<true,true>;
    }
    pcVar20 = multipredict<true,true>;
    pcVar18 = multipredict<true,false>;
  }
  if (!bVar21) {
    pcVar18 = pcVar20;
  }
LAB_0013be04:
  bVar21 = (bool)((byte)iVar7 ^ 1);
  g->predict = pcVar14;
  g->multipredict = pcVar18;
  if ((all->power_t != 0.5) || (NAN(all->power_t))) {
    uVar15 = set_learn<false>(all,bVar21,g);
  }
  else {
    uVar15 = set_learn<true>(all,bVar21,g);
  }
  uVar16 = uVar15 - 1;
  lVar5 = 0x3f;
  if (uVar16 != 0) {
    for (; uVar16 >> lVar5 == 0; lVar5 = lVar5 + -1) {
    }
  }
  stride_shift = 0;
  if (uVar16 != 0) {
    stride_shift = ((uint)lVar5 ^ 0xffffffc0) + 0x41;
  }
  if ((all->weights).sparse == true) {
    sparse_parameters::stride_shift(&(all->weights).sparse_weights,stride_shift);
    puVar19 = &(all->weights).dense_weights._stride_shift;
    if (((all->weights).sparse & 1U) != 0) {
      puVar19 = &(all->weights).sparse_weights._stride_shift;
    }
    stride_shift = *puVar19;
  }
  else {
    (all->weights).dense_weights._stride_shift = stride_shift;
  }
  plVar17 = LEARNER::init_learner<GD::gd,example,LEARNER::learner<char,char>>
                      (&local_8a0,(_func_void_gd_ptr_learner<char,_char>_ptr_example_ptr *)g->learn,
                       (_func_void_gd_ptr_learner<char,_char>_ptr_example_ptr *)g->predict,
                       1L << ((byte)stride_shift & 0x3f));
  p_Var3 = g->sensitivity;
  uVar4 = *(undefined8 *)(plVar17 + 0x18);
  *(undefined8 *)(plVar17 + 0x48) = uVar4;
  *(_func_float_gd_ptr_base_learner_ptr_example_ptr **)(plVar17 + 0x50) = p_Var3;
  *(_func_void_gd_ptr_base_learner_ptr_example_ptr_size_t_size_t_polyprediction_ptr_bool **)
   (plVar17 + 0x40) = g->multipredict;
  *(_func_void_gd_ptr_base_learner_ptr_example_ptr **)(plVar17 + 0x38) = g->update;
  *(code **)(plVar17 + 0x80) = save_load;
  *(undefined8 *)(plVar17 + 0x70) = uVar4;
  *(undefined8 *)(plVar17 + 0x78) = *(undefined8 *)(plVar17 + 0x20);
  *(undefined8 *)(plVar17 + 0x88) = uVar4;
  *(undefined8 *)(plVar17 + 0x90) = *(undefined8 *)(plVar17 + 0x20);
  *(code **)(plVar17 + 0x98) = end_pass;
  std::
  vector<std::shared_ptr<VW::config::base_option>,_std::allocator<std::shared_ptr<VW::config::base_option>_>_>
  ::~vector(&local_6b0.m_options);
  if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
       *)local_6b0.m_name._M_dataplus._M_p != &local_6b0.m_name.field_2) {
    operator_delete(local_6b0.m_name._M_dataplus._M_p);
  }
  if (local_8a0._M_t.super___uniq_ptr_impl<GD::gd,_void_(*)(void_*)>._M_t.
      super__Tuple_impl<0UL,_GD::gd_*,_void_(*)(void_*)>.super__Head_base<0UL,_GD::gd_*,_false>.
      _M_head_impl != (gd *)0x0) {
    (*(code *)local_8a0._M_t.super___uniq_ptr_impl<GD::gd,_void_(*)(void_*)>._M_t.
              super__Tuple_impl<0UL,_GD::gd_*,_void_(*)(void_*)>.
              super__Tuple_impl<1UL,_void_(*)(void_*)>.
              super__Head_base<1UL,_void_(*)(void_*),_false>._M_head_impl)
              (local_8a0._M_t.super___uniq_ptr_impl<GD::gd,_void_(*)(void_*)>._M_t.
               super__Tuple_impl<0UL,_GD::gd_*,_void_(*)(void_*)>.
               super__Head_base<0UL,_GD::gd_*,_false>._M_head_impl);
  }
  return (base_learner *)plVar17;
}

Assistant:

base_learner* setup(options_i& options, vw& all)
{
  auto g = scoped_calloc_or_throw<gd>();

  bool sgd = false;
  bool adaptive = false;
  bool adax = false;
  bool invariant = false;
  bool normalized = false;

  option_group_definition new_options("Gradient Descent options");
  new_options.add(make_option("sgd", sgd).help("use regular stochastic gradient descent update."))
      .add(make_option("adaptive", adaptive).help("use adaptive, individual learning rates."))
      .add(make_option("adax", adax).help("use adaptive learning rates with x^2 instead of g^2x^2"))
      .add(make_option("invariant", invariant).help("use safe/importance aware updates."))
      .add(make_option("normalized", normalized).help("use per feature normalized updates"))
      .add(make_option("sparse_l2", g->sparse_l2).default_value(0.f).help("use per feature normalized updates"))
      .add(make_option("l1_state", all.sd->gravity)
               .keep(all.save_resume)
               .default_value(0.)
               .help("use per feature normalized updates"))
      .add(make_option("l2_state", all.sd->contraction)
               .keep(all.save_resume)
               .default_value(1.)
               .help("use per feature normalized updates"));
  options.add_and_parse(new_options);

  g->all = &all;
  g->all->normalized_sum_norm_x = 0;
  g->no_win_counter = 0;
  g->total_weight = 0.;
  g->neg_norm_power = (all.adaptive ? (all.power_t - 1.f) : -1.f);
  g->neg_power_t = -all.power_t;
  g->adaptive = all.adaptive;
  g->normalized = all.normalized_updates;

  if (all.initial_t > 0)  // for the normalized update: if initial_t is bigger than 1 we interpret this as if we had
                          // seen (all.initial_t) previous fake datapoints all with norm 1
  {
    g->all->normalized_sum_norm_x = all.initial_t;
    g->total_weight = all.initial_t;
  }

  bool feature_mask_off = true;
  if (options.was_supplied("feature_mask"))
    feature_mask_off = false;

  if (!all.holdout_set_off)
  {
    all.sd->holdout_best_loss = FLT_MAX;
    g->early_stop_thres = options.get_typed_option<size_t>("early_terminate").value();
  }

  g->initial_constant = all.initial_constant;

  if (sgd || adaptive || invariant || normalized)
  {
    // nondefault
    all.adaptive = all.training && adaptive;
    all.invariant_updates = all.training && invariant;
    all.normalized_updates = all.training && normalized;

    if (!options.was_supplied("learning_rate") && !options.was_supplied("l") &&
        !(all.adaptive && all.normalized_updates))
      all.eta = 10;  // default learning rate to 10 for non default update rule

    // if not using normalized or adaptive, default initial_t to 1 instead of 0
    if (!all.adaptive && !all.normalized_updates)
    {
      if (!options.was_supplied("initial_t"))
      {
        all.sd->t = 1.f;
        all.initial_t = 1.f;
      }
      all.eta *= powf((float)(all.sd->t), all.power_t);
    }
  }
  else
  {
    all.adaptive = all.training;
    all.invariant_updates = all.training;
    all.normalized_updates = all.training;
  }

  if (adax)
    g->adax = all.training && adax;

  if (g->adax && !all.adaptive)
    THROW("Cannot use adax without adaptive");

  if (pow((double)all.eta_decay_rate, (double)all.numpasses) < 0.0001)
    all.trace_message << "Warning: the learning rate for the last pass is multiplied by: "
                      << pow((double)all.eta_decay_rate, (double)all.numpasses)
                      << " adjust --decay_learning_rate larger to avoid this." << endl;

  if (all.reg_mode % 2)
    if (all.audit || all.hash_inv)
    {
      g->predict = predict<true, true>;
      g->multipredict = multipredict<true, true>;
    }
    else
    {
      g->predict = predict<true, false>;
      g->multipredict = multipredict<true, false>;
    }
  else if (all.audit || all.hash_inv)
  {
    g->predict = predict<false, true>;
    g->multipredict = multipredict<false, true>;
  }
  else
  {
    g->predict = predict<false, false>;
    g->multipredict = multipredict<false, false>;
  }

  uint64_t stride;
  if (all.power_t == 0.5)
    stride = set_learn<true>(all, feature_mask_off, *g.get());
  else
    stride = set_learn<false>(all, feature_mask_off, *g.get());

  all.weights.stride_shift((uint32_t)ceil_log_2(stride - 1));

  gd* bare = g.get();
  learner<gd, example>& ret = init_learner(g, g->learn, bare->predict, ((uint64_t)1 << all.weights.stride_shift()));
  ret.set_sensitivity(bare->sensitivity);
  ret.set_multipredict(bare->multipredict);
  ret.set_update(bare->update);
  ret.set_save_load(save_load);
  ret.set_end_pass(end_pass);
  return make_base(ret);
}